

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O3

void __thiscall level_tools::create_surface(level_tools *this)

{
  xr_raw_surface *in_RSI;
  
  create_surface((level_tools *)&this[-1].m_sg_type,in_RSI);
  return;
}

Assistant:

xr_surface* level_tools::create_surface(const xr_raw_surface& raw_surface) const
{
	xr_surface* surface = new xr_surface;
	if (raw_surface.debug()) {
		surface->texture() = m_debug_texture;
		surface->set_two_sided();
	} else {
		if (m_gamemtls_lib) {
			const xr_gamemtl* gamemtl = m_gamemtls_lib->get_material(raw_surface.gamemtl);
			if (gamemtl)
				surface->gamemtl() = gamemtl->name;
			else
				msg("can't resolve game material %u", raw_surface.gamemtl);
		}
		if (raw_surface.automatic()) {
			if (m_level->xrlc_version() <= XRLC_VERSION_8)
				surface->gamemtl() = m_fake_gamemtl;
			paint_automatic(surface, raw_surface.flags);
		} else {
			surface->texture() = m_textures->at(raw_surface.texture);
			surface->eshader() = m_shaders->at(raw_surface.eshader);
			if (m_sect_auto_gamemtls) {
				surface->gamemtl() = m_ini->r_string(m_sect_auto_gamemtls,
						surface->texture().c_str());
			}
		}
		if (raw_surface.two_sided())
			surface->set_two_sided();
		guess_cshader(surface, raw_surface.flags);
		if (m_rflags & RF_DEBUG_CFORM)
			paint_debug_cform(surface, raw_surface.flags);
	}
	return surface;
}